

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_rebin_wcsd(fitsfile *fptr,int naxis,double *amin,double *binsize,int *status)

{
  bool bVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_R8;
  double dVar2;
  int *unaff_retaddr;
  double dvalue;
  char svalue [71];
  char keyname [75];
  int reset;
  int tstatus;
  int jj;
  int ii;
  double local_f0;
  int *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  fitsfile *in_stack_ffffffffffffff48;
  int local_34;
  int local_4;
  
  if (*in_R8 < 1) {
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      bVar1 = false;
      ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
      ffgky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
            in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if ((local_f0 == 1.0) && (!NAN(local_f0))) {
        bVar1 = true;
      }
      ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
      ffgky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
            in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if ((local_f0 != 1.0) || (NAN(local_f0))) {
        bVar1 = false;
      }
      dVar2 = (local_f0 - *(double *)(in_RDX + (long)local_34 * 8)) /
              *(double *)(in_RCX + (long)local_34 * 8) + 0.5;
      ffmkyd((fitsfile *)svalue._24_8_,(char *)svalue._16_8_,(double)svalue._8_8_,svalue._4_4_,
             (char *)dvalue,unaff_retaddr);
      ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
      ffgky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
            in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if ((dVar2 != 1.0) || (NAN(dVar2))) {
        bVar1 = false;
      }
      local_f0 = dVar2 * *(double *)(in_RCX + (long)local_34 * 8);
      ffmkyd((fitsfile *)svalue._24_8_,(char *)svalue._16_8_,(double)svalue._8_8_,svalue._4_4_,
             (char *)dvalue,unaff_retaddr);
      if (bVar1) {
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        ffmkyd((fitsfile *)svalue._24_8_,(char *)svalue._16_8_,(double)svalue._8_8_,svalue._4_4_,
               (char *)dvalue,unaff_retaddr);
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        local_f0 = *(double *)(in_RDX + (long)local_34 * 8) +
                   *(double *)(in_RCX + (long)local_34 * 8) / 2.0;
        ffmkyd((fitsfile *)svalue._24_8_,(char *)svalue._16_8_,(double)svalue._8_8_,svalue._4_4_,
               (char *)dvalue,unaff_retaddr);
      }
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int fits_rebin_wcsd(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      double *amin,     /* I - first pixel include in each axis        */
      double *binsize,  /* I - binning factor for each axis            */
      int *status)      
{      
   /*  Update the  WCS keywords that define the location of the reference */
   /*  pixel, and the pixel size, along each axis.   */

    int ii, jj, tstatus, reset ;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);
  
    for (ii = 0; ii < naxis; ii++)
    {
       reset = 0;  /* flag to reset the reference pixel */
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 
       if (!tstatus && dvalue == 1.0) {
           reset = 1;
       }

       tstatus = 0;
       /*  CRPIXn - update location of the ref. pix. in the binned image */
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);

       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

       if (!tstatus)
       {
           if (dvalue != 1.0)
	      reset = 0;

           /* updated value to give pixel location after binning */
           dvalue = (dvalue - amin[ii]) / ((double) binsize[ii]) + .5;  

           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
       } else {
          reset = 0;
       }

       /*  CDELTn - update unit size of pixels  */
       tstatus = 0;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);

       /* get previous (pre-binning) value */
       ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

       if (!tstatus)
       {
           if (dvalue != 1.0)
	      reset = 0;

           /* updated to give post-binning value */
           dvalue = dvalue * binsize[ii];  

           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
       }
       else
       {   /* no CDELTn keyword, so look for a CDij keywords */
          reset = 0;

          for (jj = 0; jj < naxis; jj++)
	  {
             tstatus = 0;
             ffkeyn("CD", jj + 1, svalue, &tstatus);
	     strcat(svalue,"_");
	     ffkeyn(svalue, ii + 1, keyname, &tstatus);

             /* get previous (pre-binning) value */
             ffgky(fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus); 

             if (!tstatus)
             {
                /* updated to give post-binning value */
               dvalue = dvalue * binsize[ii];  

               fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
             }
	  }
       }

       if (reset) {
          /* the original CRPIX, CRVAL, and CDELT keywords were all = 1.0 */
	  /* In this special case, reset the reference pixel to be the */
	  /* first pixel in the array (instead of possibly far off the array) */
 
           dvalue = 1.0;
           ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);

           ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
	   dvalue = amin[ii] + (binsize[ii] / 2.0);	  
           fits_modify_key_dbl(fptr, keyname, dvalue, -14, NULL, &tstatus);
	}

    }
    return(*status);
}